

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playera.cpp
# Opt level: O0

void SampleConv_toS24(void *buffer,INT32 value)

{
  undefined2 local_17;
  undefined4 local_14;
  UINT8 tmp [3];
  INT32 value_local;
  void *buffer_local;
  
  if (value < -0x800000) {
    local_14 = -0x800000;
  }
  else {
    local_14 = value;
    if (0x7fffff < value) {
      local_14 = 0x7fffff;
    }
  }
  local_17 = (undefined2)local_14;
  *(undefined2 *)buffer = local_17;
  *(char *)((long)buffer + 2) = (char)((uint)local_14 >> 0x10);
  return;
}

Assistant:

static void SampleConv_toS24(void* buffer, INT32 value)
{
	UINT8 tmp[3];
	if (value < -0x800000)
		value = -0x800000;
	else if (value > +0x7FFFFF)
		value = +0x7FFFFF;
#if defined(VGM_LITTLE_ENDIAN)
	tmp[0] = ( value       ) & 0xFF;
	tmp[1] = ( value >> 8  ) & 0xFF;
	tmp[2] = ( value >> 16 ) & 0xFF;
#elif defined(VGM_BIG_ENDIAN)
	tmp[0] = ( value >> 16 ) & 0xFF;
	tmp[1] = ( value >> 8  ) & 0xFF;
	tmp[2] = ( value       ) & 0xFF;
#else
#error unknown endianness
#endif
	memcpy(buffer,tmp,sizeof(tmp));
	return;
}